

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_RecalculateAttached3DFloors(sector_t *sec)

{
  extsector_t *peVar1;
  uint i;
  ulong uVar2;
  
  peVar1 = sec->e;
  for (uVar2 = 0; uVar2 < (peVar1->XFloor).attached.Count; uVar2 = uVar2 + 1) {
    P_Recalculate3DFloors((peVar1->XFloor).attached.Array[uVar2]);
  }
  P_Recalculate3DFloors(sec);
  return;
}

Assistant:

void P_RecalculateAttached3DFloors(sector_t * sec)
{
	extsector_t::xfloor &x = sec->e->XFloor;

	for(unsigned int i=0; i<x.attached.Size(); i++)
	{
		P_Recalculate3DFloors(x.attached[i]);
	}
	P_Recalculate3DFloors(sec);
}